

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexst.cpp
# Opt level: O2

void __thiscall icu_63::RegexStaticSets::RegexStaticSets(RegexStaticSets *this,UErrorCode *status)

{
  Regex8BitSet *__s;
  undefined1 *this_00;
  UnicodeSet *this_01;
  UnicodeSet *pUVar1;
  UText *pUVar2;
  Regex8BitSet *this_02;
  UnicodeSet *pattern;
  long lVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  UnicodeSet local_210;
  UnicodeSet **local_1b8;
  UnicodeSet **local_1b0;
  UnicodeSet **local_1a8;
  UnicodeSet **local_1a0;
  UnicodeSet **local_198;
  UnicodeSet **local_190;
  ConstChar16Ptr local_188;
  ConstChar16Ptr local_180;
  ConstChar16Ptr local_178;
  ConstChar16Ptr local_170;
  ConstChar16Ptr local_168;
  ConstChar16Ptr local_160;
  ConstChar16Ptr local_158;
  ConstChar16Ptr local_150;
  ConstChar16Ptr local_148;
  ConstChar16Ptr local_140;
  ConstChar16Ptr local_138;
  UnicodeSet *local_130;
  UnicodeSet **local_128;
  char16_t *local_120;
  char16_t *local_110;
  char16_t *local_100;
  char16_t *local_f0;
  char16_t *local_e0;
  char16_t *local_d0;
  char16_t *local_c0;
  char16_t *local_b0;
  char16_t *local_a0;
  char16_t *local_90;
  char16_t *local_80;
  UnicodeString local_70;
  
  __s = this->fPropSets8;
  lVar3 = 0;
  memset(__s,0,0x1a0);
  this_00 = &this->field_0x208;
  do {
    UnicodeSet::UnicodeSet((UnicodeSet *)(this_00 + lVar3));
    lVar3 = lVar3 + 0x58;
  } while (lVar3 != 0x370);
  local_138.p_ = (char16_t *)gUnescapeCharPattern;
  icu_63::UnicodeString::UnicodeString((UnicodeString *)&local_210,'\x01',&local_138,-1);
  pUVar1 = &this->fUnescapeCharSet;
  pattern = &local_210;
  UnicodeSet::UnicodeSet(pUVar1,(UnicodeString *)pattern,status);
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)&local_210);
  local_80 = local_138.p_;
  local_128 = &this->fRuleDigitsAlias;
  this->fRuleDigitsAlias = (UnicodeSet *)0x0;
  this->fEmptyText = (UText *)0x0;
  for (lVar3 = 0; lVar3 != 0xd; lVar3 = lVar3 + 1) {
    this->fPropSets[lVar3] = (UnicodeSet *)0x0;
  }
  this_01 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pattern);
  local_130 = pUVar1;
  if (this_01 == (UnicodeSet *)0x0) {
    local_190 = this->fPropSets + 1;
    this->fPropSets[1] = (UnicodeSet *)0x0;
  }
  else {
    local_140.p_ = (char16_t *)gIsWordPattern;
    icu_63::UnicodeString::UnicodeString((UnicodeString *)&local_210,'\x01',&local_140,-1);
    pattern = &local_210;
    UnicodeSet::UnicodeSet(this_01,(UnicodeString *)pattern,status);
    local_190 = this->fPropSets + 1;
    this->fPropSets[1] = this_01;
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)&local_210);
    local_90 = local_140.p_;
  }
  pUVar1 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pattern);
  if (pUVar1 == (UnicodeSet *)0x0) {
    local_198 = this->fPropSets + 4;
    this->fPropSets[4] = (UnicodeSet *)0x0;
  }
  else {
    local_148.p_ = (char16_t *)gIsSpacePattern;
    icu_63::UnicodeString::UnicodeString((UnicodeString *)&local_210,'\x01',&local_148,-1);
    pattern = &local_210;
    UnicodeSet::UnicodeSet(pUVar1,(UnicodeString *)pattern,status);
    local_198 = this->fPropSets + 4;
    this->fPropSets[4] = pUVar1;
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)&local_210);
    local_a0 = local_148.p_;
  }
  pUVar1 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pattern);
  if (pUVar1 == (UnicodeSet *)0x0) {
    local_1a0 = this->fPropSets + 6;
    this->fPropSets[6] = (UnicodeSet *)0x0;
  }
  else {
    local_150.p_ = (char16_t *)gGC_ExtendPattern;
    icu_63::UnicodeString::UnicodeString((UnicodeString *)&local_210,'\x01',&local_150,-1);
    pattern = &local_210;
    UnicodeSet::UnicodeSet(pUVar1,(UnicodeString *)pattern,status);
    local_1a0 = this->fPropSets + 6;
    this->fPropSets[6] = pUVar1;
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)&local_210);
    local_b0 = local_150.p_;
  }
  pUVar1 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pattern);
  if (pUVar1 == (UnicodeSet *)0x0) {
    local_1a8 = this->fPropSets + 7;
    this->fPropSets[7] = (UnicodeSet *)0x0;
  }
  else {
    local_158.p_ = (char16_t *)gGC_ControlPattern;
    icu_63::UnicodeString::UnicodeString((UnicodeString *)&local_210,'\x01',&local_158,-1);
    pattern = &local_210;
    UnicodeSet::UnicodeSet(pUVar1,(UnicodeString *)pattern,status);
    local_1a8 = this->fPropSets + 7;
    this->fPropSets[7] = pUVar1;
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)&local_210);
    local_c0 = local_158.p_;
  }
  pUVar1 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pattern);
  if (pUVar1 == (UnicodeSet *)0x0) {
    local_1b0 = this->fPropSets + 8;
    this->fPropSets[8] = (UnicodeSet *)0x0;
  }
  else {
    local_160.p_ = (char16_t *)gGC_LPattern;
    icu_63::UnicodeString::UnicodeString((UnicodeString *)&local_210,'\x01',&local_160,-1);
    pattern = &local_210;
    UnicodeSet::UnicodeSet(pUVar1,(UnicodeString *)pattern,status);
    local_1b0 = this->fPropSets + 8;
    this->fPropSets[8] = pUVar1;
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)&local_210);
    local_d0 = local_160.p_;
  }
  pUVar1 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pattern);
  if (pUVar1 == (UnicodeSet *)0x0) {
    local_1b8 = this->fPropSets + 0xb;
    this->fPropSets[0xb] = (UnicodeSet *)0x0;
  }
  else {
    local_168.p_ = (char16_t *)gGC_VPattern;
    icu_63::UnicodeString::UnicodeString((UnicodeString *)&local_210,'\x01',&local_168,-1);
    pattern = &local_210;
    UnicodeSet::UnicodeSet(pUVar1,(UnicodeString *)pattern,status);
    local_1b8 = this->fPropSets + 0xb;
    this->fPropSets[0xb] = pUVar1;
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)&local_210);
    local_e0 = local_168.p_;
  }
  pUVar1 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pattern);
  if (pUVar1 == (UnicodeSet *)0x0) {
    this->fPropSets[0xc] = (UnicodeSet *)0x0;
  }
  else {
    local_170.p_ = (char16_t *)gGC_TPattern;
    icu_63::UnicodeString::UnicodeString((UnicodeString *)&local_210,'\x01',&local_170,-1);
    pattern = &local_210;
    UnicodeSet::UnicodeSet(pUVar1,(UnicodeString *)pattern,status);
    this->fPropSets[0xc] = pUVar1;
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)&local_210);
    local_f0 = local_170.p_;
  }
  pUVar1 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pattern);
  if (pUVar1 == (UnicodeSet *)0x0) {
    this->fPropSets[9] = (UnicodeSet *)0x0;
  }
  else {
    local_178.p_ = (char16_t *)gGC_LVPattern;
    icu_63::UnicodeString::UnicodeString((UnicodeString *)&local_210,'\x01',&local_178,-1);
    pattern = &local_210;
    UnicodeSet::UnicodeSet(pUVar1,(UnicodeString *)pattern,status);
    this->fPropSets[9] = pUVar1;
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)&local_210);
    local_100 = local_178.p_;
  }
  pUVar1 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pattern);
  if (pUVar1 == (UnicodeSet *)0x0) {
    this->fPropSets[10] = (UnicodeSet *)0x0;
    bVar4 = true;
  }
  else {
    local_180.p_ = (char16_t *)gGC_LVTPattern;
    icu_63::UnicodeString::UnicodeString((UnicodeString *)&local_210,'\x01',&local_180,-1);
    pattern = &local_210;
    UnicodeSet::UnicodeSet(pUVar1,(UnicodeString *)pattern,status);
    this->fPropSets[10] = pUVar1;
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)&local_210);
    local_110 = local_180.p_;
    bVar4 = this->fPropSets[10] == (UnicodeSet *)0x0;
  }
  auVar9._0_4_ = -(uint)((int)this->fPropSets[0xc] == 0);
  auVar9._4_4_ = -(uint)((int)((ulong)this->fPropSets[0xc] >> 0x20) == 0);
  auVar9._8_4_ = -(uint)((int)this->fPropSets[9] == 0);
  auVar9._12_4_ = -(uint)((int)((ulong)this->fPropSets[9] >> 0x20) == 0);
  auVar12._4_4_ = auVar9._0_4_;
  auVar12._0_4_ = auVar9._4_4_;
  auVar12._8_4_ = auVar9._12_4_;
  auVar12._12_4_ = auVar9._8_4_;
  auVar11._0_4_ = -(uint)((int)*local_1b0 == 0);
  auVar11._4_4_ = -(uint)((int)((ulong)*local_1b0 >> 0x20) == 0);
  auVar11._8_4_ = -(uint)((int)*local_1b8 == 0);
  auVar11._12_4_ = -(uint)((int)((ulong)*local_1b8 >> 0x20) == 0);
  auVar10._4_4_ = auVar11._0_4_;
  auVar10._0_4_ = auVar11._4_4_;
  auVar10._8_4_ = auVar11._12_4_;
  auVar10._12_4_ = auVar11._8_4_;
  auVar11 = packssdw(auVar10 & auVar11,auVar12 & auVar9);
  auVar7._0_4_ = -(uint)((int)*local_1a0 == 0);
  auVar7._4_4_ = -(uint)((int)((ulong)*local_1a0 >> 0x20) == 0);
  auVar7._8_4_ = -(uint)((int)*local_1a8 == 0);
  auVar7._12_4_ = -(uint)((int)((ulong)*local_1a8 >> 0x20) == 0);
  auVar8._4_4_ = auVar7._0_4_;
  auVar8._0_4_ = auVar7._4_4_;
  auVar8._8_4_ = auVar7._12_4_;
  auVar8._12_4_ = auVar7._8_4_;
  auVar6._0_4_ = -(uint)((int)*local_190 == 0);
  auVar6._4_4_ = -(uint)((int)((ulong)*local_190 >> 0x20) == 0);
  auVar6._8_4_ = -(uint)((int)*local_198 == 0);
  auVar6._12_4_ = -(uint)((int)((ulong)*local_198 >> 0x20) == 0);
  auVar5._4_4_ = auVar6._0_4_;
  auVar5._0_4_ = auVar6._4_4_;
  auVar5._8_4_ = auVar6._12_4_;
  auVar5._12_4_ = auVar6._8_4_;
  auVar6 = packssdw(auVar5 & auVar6,auVar8 & auVar7);
  auVar6 = packssdw(auVar6,auVar11);
  if (((((((((auVar6 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar6 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar6 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar6 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar6 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar6 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar6 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar6[0xf]) &&
     (!bVar4)) {
    if (U_ZERO_ERROR < *status) {
      return;
    }
    pUVar1 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pattern);
    if (pUVar1 == (UnicodeSet *)0x0) {
      this->fPropSets[5] = (UnicodeSet *)0x0;
    }
    else {
      UnicodeSet::UnicodeSet(pUVar1,0,0x10ffff);
      this->fPropSets[5] = pUVar1;
      UnicodeSet::remove(pUVar1,(char *)0xac00);
      UnicodeSet::removeAll(this->fPropSets[5],this->fPropSets[7]);
      UnicodeSet::removeAll(this->fPropSets[5],this->fPropSets[8]);
      UnicodeSet::removeAll(this->fPropSets[5],this->fPropSets[0xb]);
      UnicodeSet::removeAll(this->fPropSets[5],this->fPropSets[0xc]);
      this_02 = __s;
      for (lVar3 = -0x68; lVar3 != 0; lVar3 = lVar3 + 8) {
        if (*(UnicodeSet **)(__s->d + lVar3) != (UnicodeSet *)0x0) {
          UnicodeSet::compact(*(UnicodeSet **)(__s->d + lVar3));
          Regex8BitSet::init(this_02,*(EVP_PKEY_CTX **)(__s->d + lVar3));
        }
        this_02 = this_02 + 1;
      }
      local_188.p_ = (char16_t *)gRuleSet_rule_char_pattern;
      icu_63::UnicodeString::UnicodeString(&local_70,'\x01',&local_188,-1);
      UnicodeSet::UnicodeSet(&local_210,&local_70,status);
      UnicodeSet::operator=((UnicodeSet *)&this->field_0x2b8,&local_210);
      UnicodeSet::~UnicodeSet(&local_210);
      icu_63::UnicodeString::~UnicodeString(&local_70);
      local_120 = local_188.p_;
      UnicodeSet::add((UnicodeSet *)&this->field_0x260,0x30,0x39);
      UnicodeSet::add((UnicodeSet *)this_00,0x41,0x5a);
      UnicodeSet::add((UnicodeSet *)this_00,0x61,0x7a);
      *local_128 = (UnicodeSet *)&this->field_0x260;
      for (lVar3 = 0; lVar3 != 0x370; lVar3 = lVar3 + 0x58) {
        UnicodeSet::compact((UnicodeSet *)(this_00 + lVar3));
      }
      pattern = (UnicodeSet *)0x0;
      pUVar2 = utext_openUChars_63((UText *)0x0,(UChar *)0x0,0,status);
      this->fEmptyText = pUVar2;
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        return;
      }
    }
  }
  for (lVar3 = 0; lVar3 != 0xd; lVar3 = lVar3 + 1) {
    pUVar1 = this->fPropSets[lVar3];
    if (pUVar1 != (UnicodeSet *)0x0) {
      UnicodeSet::~UnicodeSet(pUVar1);
    }
    UMemory::operator_delete((UMemory *)pUVar1,pattern);
    this->fPropSets[lVar3] = (UnicodeSet *)0x0;
  }
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  return;
}

Assistant:

RegexStaticSets::RegexStaticSets(UErrorCode *status)
:
fUnescapeCharSet(UnicodeString(TRUE, gUnescapeCharPattern, -1), *status),
fRuleDigitsAlias(NULL),
fEmptyText(NULL)
{
    // First zero out everything
    int i;
    for (i=0; i<URX_LAST_SET; i++) {
        fPropSets[i] = NULL;
    }
    // Then init the sets to their correct values.
    fPropSets[URX_ISWORD_SET]  = new UnicodeSet(UnicodeString(TRUE, gIsWordPattern, -1),     *status);
    fPropSets[URX_ISSPACE_SET] = new UnicodeSet(UnicodeString(TRUE, gIsSpacePattern, -1),    *status);
    fPropSets[URX_GC_EXTEND]   = new UnicodeSet(UnicodeString(TRUE, gGC_ExtendPattern, -1),  *status);
    fPropSets[URX_GC_CONTROL]  = new UnicodeSet(UnicodeString(TRUE, gGC_ControlPattern, -1), *status);
    fPropSets[URX_GC_L]        = new UnicodeSet(UnicodeString(TRUE, gGC_LPattern, -1),       *status);
    fPropSets[URX_GC_V]        = new UnicodeSet(UnicodeString(TRUE, gGC_VPattern, -1),       *status);
    fPropSets[URX_GC_T]        = new UnicodeSet(UnicodeString(TRUE, gGC_TPattern, -1),       *status);
    fPropSets[URX_GC_LV]       = new UnicodeSet(UnicodeString(TRUE, gGC_LVPattern, -1),      *status);
    fPropSets[URX_GC_LVT]      = new UnicodeSet(UnicodeString(TRUE, gGC_LVTPattern, -1),     *status);
    
    // Check for null pointers
    if (fPropSets[URX_ISWORD_SET] == NULL || fPropSets[URX_ISSPACE_SET] == NULL || fPropSets[URX_GC_EXTEND] == NULL || 
        fPropSets[URX_GC_CONTROL] == NULL || fPropSets[URX_GC_L] == NULL || fPropSets[URX_GC_V] == NULL || 
        fPropSets[URX_GC_T] == NULL || fPropSets[URX_GC_LV] == NULL || fPropSets[URX_GC_LVT] == NULL) {
        goto ExitConstrDeleteAll;
    }
    if (U_FAILURE(*status)) {
        // Bail out if we were unable to create the above sets.
        // The rest of the initialization needs them, so we cannot proceed.
        return;
    }


    //
    // The following sets  are dynamically constructed, because their
    //   initialization strings would be unreasonable.
    //


    //
    //  "Normal" is the set of characters that don't need special handling
    //            when finding grapheme cluster boundaries.
    //
    fPropSets[URX_GC_NORMAL] = new UnicodeSet(0, UnicodeSet::MAX_VALUE);
    // Null pointer check
    if (fPropSets[URX_GC_NORMAL] == NULL) {
    	goto ExitConstrDeleteAll;
    }
    fPropSets[URX_GC_NORMAL]->remove(0xac00, 0xd7a4);
    fPropSets[URX_GC_NORMAL]->removeAll(*fPropSets[URX_GC_CONTROL]);
    fPropSets[URX_GC_NORMAL]->removeAll(*fPropSets[URX_GC_L]);
    fPropSets[URX_GC_NORMAL]->removeAll(*fPropSets[URX_GC_V]);
    fPropSets[URX_GC_NORMAL]->removeAll(*fPropSets[URX_GC_T]);

    // Initialize the 8-bit fast bit sets from the parallel full
    //   UnicodeSets.
    for (i=0; i<URX_LAST_SET; i++) {
        if (fPropSets[i]) {
            fPropSets[i]->compact();
            fPropSets8[i].init(fPropSets[i]);
        }
    }

    // Sets used while parsing rules, but not referenced from the parse state table
    fRuleSets[kRuleSet_rule_char-128]   = UnicodeSet(UnicodeString(TRUE, gRuleSet_rule_char_pattern, -1),   *status);
    fRuleSets[kRuleSet_digit_char-128].add((UChar)0x30, (UChar)0x39);    // [0-9]
    fRuleSets[kRuleSet_ascii_letter-128].add((UChar)0x41, (UChar)0x5A);  // [A-Z]
    fRuleSets[kRuleSet_ascii_letter-128].add((UChar)0x61, (UChar)0x7A);  // [a-z]
    fRuleDigitsAlias = &fRuleSets[kRuleSet_digit_char-128];
    for (i=0; i<UPRV_LENGTHOF(fRuleSets); i++) {
        fRuleSets[i].compact();
    }
    
    // Finally, initialize an empty string for utility purposes
    fEmptyText = utext_openUChars(NULL, NULL, 0, status);
    
    if (U_SUCCESS(*status)) {
        return;
    }

ExitConstrDeleteAll: // Remove fPropSets and fRuleSets and return error
    for (i=0; i<URX_LAST_SET; i++) {
        delete fPropSets[i];
        fPropSets[i] = NULL;
    }
    if (U_SUCCESS(*status)) {
        *status = U_MEMORY_ALLOCATION_ERROR;
    }
}